

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

void __thiscall
kj::_::
Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>
::Tuple<kj::HttpClient::ConnectRequest::Status,kj::Exception>
          (Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>
           *this,Tuple<kj::HttpClient::ConnectRequest::Status,_kj::Exception> *other)

{
  Tuple<kj::HttpClient::ConnectRequest::Status,_kj::Exception> *other_00;
  Tuple<kj::HttpClient::ConnectRequest::Status,_kj::Exception> *other_local;
  Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
  *this_local;
  
  other_00 = mv<kj::_::Tuple<kj::HttpClient::ConnectRequest::Status,kj::Exception>>(other);
  TupleImpl<kj::_::Indexes<0ul,1ul>,kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>
  ::TupleImpl<kj::HttpClient::ConnectRequest::Status,kj::Exception>
            ((TupleImpl<kj::_::Indexes<0ul,1ul>,kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>
              *)this,other_00);
  return;
}

Assistant:

constexpr inline Tuple(Tuple<U...>&& other): impl(kj::mv(other)) {}